

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.h
# Opt level: O2

void pybind11::detail::initimpl::construct<pybind11::class_<kratos::ParamType>>
               (value_and_holder *v_h,Cpp<pybind11::class_<kratos::ParamType>_> *result,
               bool need_alias)

{
  Cpp<pybind11::class_<kratos::ParamType>_> *pCVar1;
  
  pCVar1 = (Cpp<pybind11::class_<kratos::ParamType>_> *)operator_new(4);
  *pCVar1 = *result;
  *v_h->vh = pCVar1;
  return;
}

Assistant:

void construct(value_and_holder &v_h, Cpp<Class> &&result, bool need_alias) {
    PYBIND11_WORKAROUND_INCORRECT_MSVC_C4100(need_alias);
    static_assert(std::is_move_constructible<Cpp<Class>>::value,
        "pybind11::init() return-by-value factory function requires a movable class");
    if (PYBIND11_SILENCE_MSVC_C4127(Class::has_alias) && need_alias)
        construct_alias_from_cpp<Class>(is_alias_constructible<Class>{}, v_h, std::move(result));
    else
        v_h.value_ptr() = new Cpp<Class>(std::move(result));
}